

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  Node *local_38;
  Node *parent;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *rowgroup_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((rowgroup->tag->model & 1) != 0) {
    return;
  }
LAB_00149909:
  while( true ) {
    while( true ) {
      do {
        parent = prvTidyGetToken(doc,IgnoreWhitespace);
        if (parent == (Node *)0x0) {
          return;
        }
        if (parent->tag == rowgroup->tag) {
          if (parent->type != EndTag) {
            prvTidyUngetToken(doc);
            return;
          }
          rowgroup->closed = yes;
          prvTidyFreeNode(doc,parent);
          return;
        }
        if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
            (parent->tag->id == TidyTag_TABLE)) && (parent->type == EndTag)) {
          prvTidyUngetToken(doc);
          return;
        }
        BVar2 = InsertMisc(rowgroup,parent);
      } while (BVar2 != no);
      if ((parent->tag != (Dict *)0x0) || (parent->type == TextNode)) break;
      prvTidyReport(doc,rowgroup,parent,0x235);
      prvTidyFreeNode(doc,parent);
    }
    if (parent->type == EndTag) break;
    if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
        (parent->tag->id == TidyTag_TD)) ||
       (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TH))
       )) {
      prvTidyUngetToken(doc);
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,rowgroup,parent,0x261);
      break;
    }
    BVar2 = prvTidynodeIsText(parent);
    if ((BVar2 == no) && (BVar2 = prvTidynodeHasCM(parent,0x18), BVar2 == no)) {
      if ((parent->tag->model & 4) == 0) break;
      prvTidyReport(doc,rowgroup,parent,0x27e);
      MoveToHead(doc,rowgroup,parent);
    }
    else {
      MoveBeforeTable(doc,rowgroup,parent);
      prvTidyReport(doc,rowgroup,parent,0x27e);
      pLVar1->exiled = yes;
      if (parent->type != TextNode) {
        ParseTag(doc,parent,IgnoreWhitespace);
      }
      pLVar1->exiled = no;
    }
  }
  if (parent->type == EndTag) {
    if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
        (parent->tag->id == TidyTag_FORM)) || (BVar2 = prvTidynodeHasCM(parent,0x18), BVar2 != no))
    {
      if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_FORM)) {
        BadForm(doc);
      }
      prvTidyReport(doc,rowgroup,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_00149909;
    }
    if (((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_TR)) ||
        (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TD)
         ))) || (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) &&
                 (parent->tag->id == TidyTag_TH)))) {
      prvTidyReport(doc,rowgroup,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_00149909;
    }
    for (local_38 = rowgroup->parent; local_38 != (Node *)0x0; local_38 = local_38->parent) {
      if (parent->tag == local_38->tag) {
        prvTidyUngetToken(doc);
        return;
      }
    }
  }
  if (((parent->tag->model & 0x100) != 0) && (parent->type != EndTag)) {
    prvTidyUngetToken(doc);
    return;
  }
  if (parent->type == EndTag) {
    prvTidyReport(doc,rowgroup,parent,0x235);
    prvTidyFreeNode(doc,parent);
  }
  else {
    if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) || (parent->tag->id != TidyTag_TR)
       ) {
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,rowgroup,parent,0x261);
      prvTidyUngetToken(doc);
    }
    prvTidyInsertNodeAtEnd(rowgroup,parent);
    ParseTag(doc,parent,IgnoreWhitespace);
  }
  goto LAB_00149909;
}

Assistant:

void TY_(ParseRowGroup)(TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (rowgroup->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == rowgroup->tag)
        {
            if (node->type == EndTag)
            {
                rowgroup->closed = yes;
                TY_(FreeNode)( doc, node);
                return;
            }

            TY_(UngetToken)( doc );
            return;
        }

        /* if </table> infer end tag */
        if ( nodeIsTABLE(node) && node->type == EndTag )
        {
            TY_(UngetToken)( doc );
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(rowgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          if TD or TH then infer <TR>
          if text or inline or block move before table
          if head content move to head
        */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node)
                      || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                MoveBeforeTable( doc, rowgroup, node );
                TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode)
                    ParseTag(doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                MoveToHead(doc, rowgroup, node);
                continue;
            }
        }

        /* 
          if this is the end tag for ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = rowgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    return;
                }
            }
        }

        /*
          if THEAD, TFOOT or TBODY then implied end tag

        */
        if (node->tag->model & CM_ROWGRP)
        {
            if (node->type != EndTag)
            {
                TY_(UngetToken)( doc );
                return;
            }
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        if ( !nodeIsTR(node) )
        {
            node = TY_(InferredTag)(doc, TidyTag_TR);
            TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
            TY_(UngetToken)( doc );
        }

       /* node should be <TR> */
        TY_(InsertNodeAtEnd)(rowgroup, node);
        ParseTag(doc, node, IgnoreWhitespace);
    }

}